

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::
     ParseTimeSampledEnumProperty<tinyusdz::GeomCamera::Projection,tinyusdz::GeomCamera::Projection>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::GeomCamera::Projection> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
               *result,string *warn,string *err)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  vtable_type *pvVar3;
  bool bVar4;
  byte bVar5;
  uint32_t uVar6;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  optional<tinyusdz::Interpolation> *poVar10;
  undefined8 *puVar11;
  Attribute *args_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined7 uVar14;
  optional<tinyusdz::Interpolation> __return_storage_ptr__;
  anon_struct_8_0_00000001_for___align *paVar13;
  char *pcVar15;
  undefined7 in_register_00000031;
  char *pcVar16;
  ulong uVar17;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *args_1;
  string *args_2;
  int iVar18;
  anon_struct_8_0_00000001_for___align this;
  _Alloc_hider _Var19;
  expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  Animatable<tinyusdz::GeomCamera::Projection> animatable_value;
  ostringstream ss_e;
  string local_2a0;
  undefined1 local_280 [8];
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  undefined1 local_258 [8];
  undefined1 local_250 [44];
  undefined4 local_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e8;
  undefined1 auStack_1d8 [40];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [24];
  storage_t<double> sStack_190;
  storage_t<tinyusdz::Token> asStack_188 [2];
  ios_base local_138 [264];
  
  if (result == (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                 *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x69b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"[Internal error] `result` arg is nullptr.",0x29);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_00272a36;
    ::std::__cxx11::stringbuf::str();
    plVar8 = (long *)::std::__cxx11::string::_M_append(local_280,(ulong)(err->_M_dataplus)._M_p);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      aStack_1e8._M_local_buf[0] = (char)paVar12->_M_allocated_capacity;
      aStack_1e8._M_allocated_capacity._1_7_ = (undefined7)(paVar12->_M_allocated_capacity >> 8);
      aStack_1e8._M_local_buf[8] = (char)plVar8[3];
      aStack_1e8._9_7_ = (undefined7)((ulong)plVar8[3] >> 8);
      local_1f8._0_8_ = &aStack_1e8;
    }
    else {
      aStack_1e8._M_local_buf[0] = (char)paVar12->_M_allocated_capacity;
      aStack_1e8._M_allocated_capacity._1_7_ = (undefined7)(paVar12->_M_allocated_capacity >> 8);
      local_1f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_1f8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar8 + 1);
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &aStack_1e8) {
      operator_delete((void *)local_1f8._0_8_,
                      CONCAT71(aStack_1e8._M_allocated_capacity._1_7_,aStack_1e8._M_local_buf[0]) +
                      1);
    }
    if (local_280 == (undefined1  [8])(local_278 + 8)) goto LAB_00272a36;
  }
  else {
    auStack_1d8._12_4_ = (undefined4)CONCAT71(in_register_00000031,strict_allowedToken_check);
    args_00 = attr;
    args_1 = result;
    args_2 = warn;
    bVar4 = Attribute::is_connection(attr);
    if (!bVar4) {
      local_258 = (undefined1  [8])prop_name;
      auStack_1d8._32_8_ = enum_handler;
      if (attr->_variability == Uniform) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar3 = (attr->_var)._value.v_.vtable;
          if (pvVar3 == (vtable_type *)0x0) {
            bVar4 = false;
          }
          else {
            uVar6 = (*pvVar3->type_id)();
            bVar4 = uVar6 == 4;
          }
          if ((bVar4) || (((attr->_var)._blocked & 1U) != 0)) {
            result->_blocked = true;
            return true;
          }
        }
        bVar4 = primvar::PrimVar::is_timesamples(&attr->_var);
        if (bVar4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6ac);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          local_280 = (undefined1  [8])(local_278 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,
                     "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned."
                     ,"");
          prop_name = (string *)local_258;
          goto LAB_00272776;
        }
        primvar::PrimVar::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)local_1a8,&attr->_var);
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          if ((storage_t<double> *)local_1a8._8_8_ == &sStack_190) {
            local_1f8._8_8_ = (long)aStack_1e8._M_local_buf + 8;
            auStack_1d8[0] = asStack_188[0]._0_1_;
          }
          else {
            local_1f8._8_8_ = local_1a8._8_8_;
          }
          aStack_1e8._M_allocated_capacity._1_7_ = local_1a8._17_7_;
          aStack_1e8._M_local_buf[0] = local_1a8[0x10];
          aStack_1e8._9_7_ = sStack_190._1_7_;
          aStack_1e8._M_local_buf[8] = sStack_190._0_1_;
          local_1f8[0] = 1;
          if (*(long *)(auStack_1d8._32_8_ + 0x10) == 0) goto LAB_00274664;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1f8 + 8);
          (**(code **)(auStack_1d8._32_8_ + 0x18))
                    ((expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_280,(_Any_data *)auStack_1d8._32_8_,args);
          if (aStack_268._M_local_buf[8] == '\x01') {
            sStack_190._0_1_ = '\0';
            sStack_190._1_7_ = 0;
            asStack_188[0]._0_1_ = 0;
            local_1a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1a8[0x10] = '\0';
            local_1a8._17_7_ = 0;
            local_1a8._0_4_ = local_280._0_4_;
            local_1a8._4_2_ = 1;
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>
            ::operator=((optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>> *)
                        &result->_attrib,(Animatable<tinyusdz::GeomCamera::Projection> *)local_1a8);
            if ((anon_struct_8_0_00000001_for___align)local_1a8._8_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              operator_delete((void *)local_1a8._8_8_,
                              CONCAT71(sStack_190._1_7_,sStack_190._0_1_) - local_1a8._8_8_);
            }
LAB_002745f8:
            bVar4 = true;
          }
          else {
            if (auStack_1d8[0xc] == '\0') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6b7);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2a0,
                         "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
              if ((string)local_1f8[0] == (string)0x0) goto LAB_00274669;
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)local_250,(fmt *)&local_2a0,(string *)local_258,args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
                operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if (warn != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,&local_2a0,err);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_250);
                if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              result->_empty = true;
              goto LAB_002745f8;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6b5);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            paVar2 = &local_2a0.field_2;
            local_2a0._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2a0,"Attribute `{}`: `{}` is not an allowed token.","");
            if ((string)local_1f8[0] == (string)0x0) goto LAB_00274669;
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_250,(fmt *)&local_2a0,(string *)local_258,args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != paVar2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_250,&local_2a0,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_250);
              if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
                operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != paVar2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar4 = false;
          }
          if ((aStack_268._M_local_buf[8] == '\0') &&
             (local_280 != (undefined1  [8])(local_278 + 8))) {
            operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
          }
        }
        else {
          local_1f8[0] = local_1a8[0];
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6bc);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          _Var1._M_p = local_250 + 0x10;
          local_250._0_8_ = _Var1._M_p;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_250,
                     "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                     ,"");
          Attribute::type_name_abi_cxx11_(&local_2a0,attr);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_280,(fmt *)local_250,(string *)local_258,&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_280,local_278._0_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if (local_280 != (undefined1  [8])(local_278 + 8)) {
            operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_250._0_8_ != _Var1._M_p) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_280,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_250,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_280);
            if (local_280 != (undefined1  [8])(local_278 + 8)) {
              operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
            }
            if ((pointer)local_250._0_8_ != _Var1._M_p) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar4 = false;
        }
        if ((string)local_1f8[0] != (string)0x1) {
          return bVar4;
        }
        if (local_1f8._8_8_ == (long)aStack_1e8._M_local_buf + 8) {
          return bVar4;
        }
        uVar17 = CONCAT71(aStack_1e8._9_7_,aStack_1e8._M_local_buf[8]) + 1;
        goto LAB_0027441f;
      }
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffff000000000000;
      local_1f8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      aStack_1e8._M_local_buf[0] = '\0';
      aStack_1e8._M_allocated_capacity._1_7_ = 0;
      aStack_1e8._M_local_buf[8] = '\0';
      aStack_1e8._9_7_ = 0;
      auStack_1d8[0] = 0;
      if ((attr->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (attr->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar3 = (attr->_var)._value.v_.vtable;
        if (pvVar3 == (vtable_type *)0x0) {
          bVar4 = false;
          uVar14 = 0;
        }
        else {
          uVar6 = (*pvVar3->type_id)();
          bVar4 = uVar6 == 4;
          uVar14 = (undefined7)((ulong)args_00 >> 8);
        }
        bVar5 = (attr->_var)._blocked;
        if (!bVar4 && (bVar5 & 1) == 0) goto LAB_00272e59;
        result->_blocked = true;
        local_224 = (undefined4)CONCAT71(uVar14,1);
      }
      else {
        bVar5 = (attr->_var)._blocked;
LAB_00272e59:
        local_224 = 0;
      }
      __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)&attr->_var;
      local_200 = (undefined1  [8])__return_storage_ptr__;
      auStack_1d8._24_8_ = warn;
      if ((((bVar5 & 1) == 0) &&
          (pvVar3 = (attr->_var)._value.v_.vtable, pvVar3 != (vtable_type *)0x0)) &&
         ((uVar6 = (*pvVar3->type_id)(), this = (anon_struct_8_0_00000001_for___align)local_200,
          uVar6 == 0 ||
          ((pvVar3 = (attr->_var)._value.v_.vtable, pvVar3 != (vtable_type *)0x0 &&
           (uVar6 = (*pvVar3->type_id)(), this = (anon_struct_8_0_00000001_for___align)local_200,
           uVar6 == 1)))))) {
LAB_002735f5:
        lVar9 = (long)(attr->_var)._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(attr->_var)._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar9 == 0) {
          bVar4 = true;
          bVar5 = (byte)local_224;
joined_r0x00273ea7:
          if (bVar5 == 0) goto LAB_00274403;
        }
        else {
          auStack_1d8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          do {
            primvar::PrimVar::get_ts_time
                      ((optional<double> *)local_1a8,(PrimVar *)this,auStack_1d8._16_8_);
            if ((ostringstream)local_1a8[0] == (ostringstream)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6ef);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              pcVar16 = "Internal error. Failed to get timecode for `{}`";
              pcVar15 = "";
LAB_00274030:
              _Var19._M_p = local_250 + 0x10;
              local_250._0_8_ = _Var19._M_p;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,pcVar16,pcVar15)
              ;
              fmt::format<std::__cxx11::string>
                        ((string *)local_280,(fmt *)local_250,(string *)local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_280,local_278._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              _Var1._M_p = local_278 + 8;
              if (local_280 != (undefined1  [8])_Var1._M_p) {
                operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
              }
              if ((pointer)local_250._0_8_ != _Var19._M_p) {
                operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar11 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_250,(ulong)(err->_M_dataplus)._M_p);
                paVar13 = (anon_struct_8_0_00000001_for___align *)(puVar11 + 2);
                if ((anon_struct_8_0_00000001_for___align *)*puVar11 == paVar13) {
                  local_278._8_8_ = *paVar13;
                  aStack_268._M_allocated_capacity = puVar11[3];
                  local_280 = (undefined1  [8])_Var1._M_p;
                }
                else {
                  local_278._8_8_ = *paVar13;
                  local_280 = (undefined1  [8])*puVar11;
                }
                local_278._0_8_ = *(optional<tinyusdz::Interpolation> *)(puVar11 + 1);
                *puVar11 = paVar13;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_280);
                if (local_280 != (undefined1  [8])_Var1._M_p) {
                  operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
                }
                if ((pointer)local_250._0_8_ != _Var19._M_p) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              goto LAB_00274401;
            }
            local_1b0 = (undefined1  [8])local_1a8._8_8_;
            primvar::PrimVar::is_ts_value_blocked((PrimVar *)local_1a8,(size_t)this);
            if ((ostringstream)local_1a8[0] != (ostringstream)0x1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6f9);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              pcVar16 = "Internal error. Failed to get valueblock info for `{}`";
              pcVar15 = "";
              goto LAB_00274030;
            }
            if (local_1a8[1] == '\x01') {
              TypedTimeSamples<tinyusdz::GeomCamera::Projection>::add_blocked_sample
                        ((TypedTimeSamples<tinyusdz::GeomCamera::Projection> *)(local_1f8 + 8),
                         (double)local_1b0);
            }
            else {
              primvar::PrimVar::get_ts_value<tinyusdz::Token>
                        ((optional<tinyusdz::Token> *)local_1a8,(PrimVar *)this,auStack_1d8._16_8_);
              local_280[0] = local_1a8[0];
              if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
                __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)&aStack_268;
                paVar2 = &local_2a0.field_2;
                local_278._0_8_ = __return_storage_ptr__;
                if ((storage_t<double> *)local_1a8._8_8_ != &sStack_190) {
                  local_278._0_8_ = local_1a8._8_8_;
                }
                aStack_268._M_allocated_capacity._1_7_ = sStack_190._1_7_;
                aStack_268._M_local_buf[0] = sStack_190._0_1_;
                local_278._9_7_ = local_1a8._17_7_;
                local_278[8] = local_1a8[0x10];
                if (*(long *)(auStack_1d8._32_8_ + 0x10) == 0) goto LAB_00274664;
                (**(code **)(auStack_1d8._32_8_ + 0x18))
                          ((expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_250,(_Any_data *)auStack_1d8._32_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_278);
                if ((bool)local_250[0x20] == true) {
                  TypedTimeSamples<tinyusdz::GeomCamera::Projection>::add_sample
                            ((TypedTimeSamples<tinyusdz::GeomCamera::Projection> *)(local_1f8 + 8),
                             (double)local_1b0,(Projection *)local_250);
                  iVar18 = 0;
                }
                else if (auStack_1d8[0xc] == '\0') {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x703);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_220._0_8_ = (long)local_220 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_220,
                             "Attribute `{}`: `{}` at {}\'th timesample is not an allowed token. Ignore it."
                             ,"");
                  if ((string)local_280[0] == (string)0x0) goto LAB_00274669;
                  __return_storage_ptr__ =
                       (optional<tinyusdz::Interpolation>)((long)auStack_1d8 + 0x10);
                  args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                            *)local_278;
                  fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                            (&local_2a0,(fmt *)local_220,(string *)local_258,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__,(unsigned_long *)args_1,args_2);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                      local_2a0._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                  if (local_220._0_8_ != (long)local_220 + 0x10) {
                    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
                  }
                  if ((string *)auStack_1d8._24_8_ != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    poVar10 = (optional<tinyusdz::Interpolation> *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)local_220,(ulong)(err->_M_dataplus)._M_p);
                    __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)(poVar10 + 2);
                    if (*poVar10 == __return_storage_ptr__) {
                      local_2a0.field_2._M_allocated_capacity =
                           *(undefined8 *)__return_storage_ptr__;
                      local_2a0.field_2._8_8_ = poVar10[3];
                      local_2a0._M_dataplus._M_p = (pointer)paVar2;
                    }
                    else {
                      local_2a0.field_2._M_allocated_capacity =
                           *(undefined8 *)__return_storage_ptr__;
                      local_2a0._M_dataplus._M_p = (pointer)*poVar10;
                    }
                    local_2a0._M_string_length = *(size_type *)(poVar10 + 1);
                    *poVar10 = __return_storage_ptr__;
                    poVar10[1].has_value_ = false;
                    *(undefined3 *)&poVar10[1].field_0x1 = 0;
                    poVar10[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                    poVar10[2].has_value_ = false;
                    ::std::__cxx11::string::operator=
                              ((string *)auStack_1d8._24_8_,(string *)&local_2a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_2a0._M_dataplus._M_p,
                                      local_2a0.field_2._M_allocated_capacity + 1);
                    }
                    if (local_220._0_8_ != (long)local_220 + 0x10) {
                      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  iVar18 = 0x16;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x701);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_220._0_8_ = (long)local_220 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_220,"Attribute `{}`: `{}` is not an allowed token.","")
                  ;
                  if ((string)local_280[0] == (string)0x0) goto LAB_00274669;
                  __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)local_278;
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            (&local_2a0,(fmt *)local_220,(string *)local_258,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_1);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                      local_2a0._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                  if (local_220._0_8_ != (long)local_220 + 0x10) {
                    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    poVar10 = (optional<tinyusdz::Interpolation> *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)local_220,(ulong)(err->_M_dataplus)._M_p);
                    __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)(poVar10 + 2);
                    if (*poVar10 == __return_storage_ptr__) {
                      local_2a0.field_2._M_allocated_capacity =
                           *(undefined8 *)__return_storage_ptr__;
                      local_2a0.field_2._8_8_ = poVar10[3];
                      local_2a0._M_dataplus._M_p = (pointer)paVar2;
                    }
                    else {
                      local_2a0.field_2._M_allocated_capacity =
                           *(undefined8 *)__return_storage_ptr__;
                      local_2a0._M_dataplus._M_p = (pointer)*poVar10;
                    }
                    local_2a0._M_string_length = *(size_type *)(poVar10 + 1);
                    *poVar10 = __return_storage_ptr__;
                    poVar10[1].has_value_ = false;
                    *(undefined3 *)&poVar10[1].field_0x1 = 0;
                    poVar10[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                    poVar10[2].has_value_ = false;
                    ::std::__cxx11::string::operator=((string *)err,(string *)&local_2a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_2a0._M_dataplus._M_p,
                                      local_2a0.field_2._M_allocated_capacity + 1);
                    }
                    if (local_220._0_8_ != (long)local_220 + 0x10) {
                      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  iVar18 = 1;
                }
                if (((bool)local_250[0x20] == false) &&
                   ((undefined1 *)local_250._0_8_ != local_250 + 0x10)) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x707);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a0,
                           "Internal error. Maybe type mismatch? Attribute `{}`\'s {}\'th timesample must be type `token`, but got type `{}`"
                           ,"");
                args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                          *)local_220;
                Attribute::type_name_abi_cxx11_((string *)args_1,attr);
                __return_storage_ptr__ =
                     (optional<tinyusdz::Interpolation>)((long)auStack_1d8 + 0x10);
                fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                          ((string *)local_250,(fmt *)&local_2a0,(string *)local_258,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __return_storage_ptr__,(unsigned_long *)args_1,args_2);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                _Var1._M_p = local_250 + 0x10;
                if ((pointer)local_250._0_8_ != _Var1._M_p) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
                if (local_220._0_8_ != (long)local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  poVar10 = (optional<tinyusdz::Interpolation> *)
                            ::std::__cxx11::string::_M_append
                                      ((char *)&local_2a0,(ulong)(err->_M_dataplus)._M_p);
                  __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)(poVar10 + 2);
                  if (*poVar10 == __return_storage_ptr__) {
                    local_250._16_8_ = *(undefined8 *)__return_storage_ptr__;
                    local_250._24_8_ = poVar10[3];
                    local_250._0_8_ = _Var1._M_p;
                  }
                  else {
                    local_250._16_8_ = *(undefined8 *)__return_storage_ptr__;
                    local_250._0_8_ = *poVar10;
                  }
                  local_250._8_8_ = poVar10[1];
                  *poVar10 = __return_storage_ptr__;
                  poVar10[1].has_value_ = false;
                  *(undefined3 *)&poVar10[1].field_0x1 = 0;
                  poVar10[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                  poVar10[2].has_value_ = false;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_250);
                  if ((pointer)local_250._0_8_ != _Var1._M_p) {
                    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                iVar18 = 1;
              }
              if (((string)local_280[0] == (string)0x1) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &aStack_268)) {
                operator_delete((void *)local_278._0_8_,aStack_268._0_8_ + 1);
              }
              if ((iVar18 != 0x16) && (bVar4 = iVar18 == 0, !bVar4)) {
                bVar5 = (byte)local_224 & bVar4;
                goto joined_r0x00273ea7;
              }
            }
            auStack_1d8._16_8_ = auStack_1d8._16_8_ + 1;
            this = (anon_struct_8_0_00000001_for___align)local_200;
          } while ((ulong)auStack_1d8._16_8_ < (ulong)((lVar9 >> 3) * -0x3333333333333333));
        }
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>::
        operator=((optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>> *)
                  &result->_attrib,(Animatable<tinyusdz::GeomCamera::Projection> *)local_1f8);
        bVar4 = true;
      }
      else {
        primvar::PrimVar::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)local_1a8,(PrimVar *)local_200);
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          if ((storage_t<double> *)local_1a8._8_8_ == &sStack_190) {
            local_278._0_8_ = &aStack_268;
          }
          else {
            local_278._0_8_ = local_1a8._8_8_;
          }
          aStack_268._M_allocated_capacity._1_7_ = sStack_190._1_7_;
          aStack_268._M_local_buf[0] = sStack_190._0_1_;
          __return_storage_ptr__._1_7_ = local_1a8._17_7_;
          __return_storage_ptr__.has_value_ = (bool)local_1a8[0x10];
          local_280[0] = 1;
          if ((enum_handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00274664:
            ::std::__throw_bad_function_call();
          }
          local_278._8_8_ = __return_storage_ptr__;
          (*enum_handler->_M_invoker)
                    ((expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_250,(_Any_data *)enum_handler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278)
          ;
          if ((bool)local_250[0x20] == true) {
            local_1f8._4_2_ = 1;
            local_1f8._0_4_ = local_250._0_4_;
            bVar4 = true;
            local_224 = (undefined4)CONCAT71((uint7)SUB83(local_250._0_8_,1),1);
          }
          else if (auStack_1d8[0xc] == '\0') {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6da);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_220._0_8_ = (long)local_220 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_220,
                       "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
            if ((string)local_280[0] == (string)0x0) goto LAB_00274669;
            __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)local_278;
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_2a0,(fmt *)local_220,(string *)local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                local_2a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_220._0_8_ != (long)local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
            }
            if ((string *)auStack_1d8._24_8_ != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_2a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_220,err);
              ::std::__cxx11::string::operator=((string *)auStack_1d8._24_8_,(string *)&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if (local_220._0_8_ != (long)local_220 + 0x10) {
                operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar4 = true;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6d8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_220._0_8_ = (long)local_220 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_220,"Attribute `{}`: `{}` is not an allowed token.","");
            if ((string)local_280[0] == (string)0x0) {
LAB_00274669:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,
                            "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                           );
            }
            __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)local_278;
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_2a0,(fmt *)local_220,(string *)local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                local_2a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_220._0_8_ != (long)local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_2a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_220,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if (local_220._0_8_ != (long)local_220 + 0x10) {
                operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar4 = false;
          }
          this = (anon_struct_8_0_00000001_for___align)local_200;
          if (((bool)local_250[0x20] == false) &&
             ((undefined1 *)local_250._0_8_ != local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
        }
        else {
          local_280[0] = local_1a8[0];
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6df);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,
                     "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                     ,"");
          __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)local_220;
          Attribute::type_name_abi_cxx11_((string *)__return_storage_ptr__,attr);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_250,(fmt *)&local_2a0,(string *)local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          _Var1._M_p = local_250 + 0x10;
          if ((pointer)local_250._0_8_ != _Var1._M_p) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          this = (anon_struct_8_0_00000001_for___align)local_200;
          if (local_220._0_8_ != (long)local_220 + 0x10) {
            operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            poVar10 = (optional<tinyusdz::Interpolation> *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_2a0,(ulong)(err->_M_dataplus)._M_p);
            __return_storage_ptr__ = (optional<tinyusdz::Interpolation>)(poVar10 + 2);
            if (*poVar10 == __return_storage_ptr__) {
              local_250._16_8_ = *(undefined8 *)__return_storage_ptr__;
              local_250._24_8_ = poVar10[3];
              local_250._0_8_ = _Var1._M_p;
            }
            else {
              local_250._16_8_ = *(undefined8 *)__return_storage_ptr__;
              local_250._0_8_ = *poVar10;
            }
            local_250._8_8_ = poVar10[1];
            *poVar10 = __return_storage_ptr__;
            poVar10[1].has_value_ = false;
            *(undefined3 *)&poVar10[1].field_0x1 = 0;
            poVar10[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
            poVar10[2].has_value_ = false;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_250);
            if ((pointer)local_250._0_8_ != _Var1._M_p) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar4 = false;
        }
        if (((string)local_280[0] == (string)0x1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &aStack_268)) {
          operator_delete((void *)local_278._0_8_,aStack_268._0_8_ + 1);
        }
        if (bVar4) goto LAB_002735f5;
LAB_00274401:
        bVar4 = false;
      }
LAB_00274403:
      if ((anon_struct_8_0_00000001_for___align)local_1f8._8_8_ ==
          (anon_struct_8_0_00000001_for___align)0x0) {
        return bVar4;
      }
      uVar17 = CONCAT71(aStack_1e8._9_7_,aStack_1e8._M_local_buf[8]) - local_1f8._8_8_;
LAB_0027441f:
      operator_delete((void *)local_1f8._8_8_,uVar17);
      return bVar4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x69f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_280 = (undefined1  [8])(local_278 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,
               "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}"
               ,"");
LAB_00272776:
    fmt::format<std::__cxx11::string>
              ((string *)local_1f8,(fmt *)local_280,(string *)prop_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &aStack_1e8) {
      operator_delete((void *)local_1f8._0_8_,
                      CONCAT71(aStack_1e8._M_allocated_capacity._1_7_,aStack_1e8._M_local_buf[0]) +
                      1);
    }
    if (local_280 != (undefined1  [8])(local_278 + 8)) {
      operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
    }
    if (err == (string *)0x0) goto LAB_00272a36;
    ::std::__cxx11::stringbuf::str();
    plVar8 = (long *)::std::__cxx11::string::_M_append(local_280,(ulong)(err->_M_dataplus)._M_p);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      aStack_1e8._M_local_buf[0] = (char)paVar12->_M_allocated_capacity;
      aStack_1e8._M_allocated_capacity._1_7_ = (undefined7)(paVar12->_M_allocated_capacity >> 8);
      aStack_1e8._M_local_buf[8] = (char)plVar8[3];
      aStack_1e8._9_7_ = (undefined7)((ulong)plVar8[3] >> 8);
      local_1f8._0_8_ = &aStack_1e8;
    }
    else {
      aStack_1e8._M_local_buf[0] = (char)paVar12->_M_allocated_capacity;
      aStack_1e8._M_allocated_capacity._1_7_ = (undefined7)(paVar12->_M_allocated_capacity >> 8);
      local_1f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_1f8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar8 + 1);
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &aStack_1e8) {
      operator_delete((void *)local_1f8._0_8_,
                      CONCAT71(aStack_1e8._M_allocated_capacity._1_7_,aStack_1e8._M_local_buf[0]) +
                      1);
    }
    if (local_280 == (undefined1  [8])(local_278 + 8)) goto LAB_00272a36;
  }
  operator_delete((void *)local_280,(ulong)(local_278._8_8_ + 1));
LAB_00272a36:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ParseTimeSampledEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<Animatable<T>> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // default and/or TimeSamples
    bool has_default{false};
    bool has_timesamples{false};

    Animatable<T> animatable_value;

    if (attr.is_blocked()) {
      result->set_blocked(true);
      has_default = true;
      //return true;
    }

    if (attr.get_var().has_default()) {
      DCOUT("has default.");

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          animatable_value.set_default(e.value());
          has_default = true;
          //return true;

        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          //result->set_value_empty();
          //return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    }

    if (attr.get_var().has_timesamples()) {
      DCOUT("has timesamples.");
      size_t n = attr.get_var().num_timesamples();

      for (size_t i = 0; i < n; i++) {

        double sample_time{value::TimeCode::Default()};

        if (auto pv = attr.get_var().get_ts_time(i)) {
          sample_time = pv.value();
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get timecode for `{}`", prop_name);
        }

        if (auto pv = attr.get_var().is_ts_value_blocked(i)) {
          if (pv.value() == true) {
            animatable_value.add_blocked_sample(sample_time);
            continue;
          }
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get valueblock info for `{}`", prop_name);
        }

        if (auto tok = attr.get_var().get_ts_value<value::token>(i)) {
          auto e = enum_handler(tok.value().str());
          if (e) {
            animatable_value.add_sample(sample_time, e.value());
          } else if (strict_allowedToken_check) {
            PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
          } else {
            PUSH_WARN_F("Attribute `{}`: `{}` at {}'th timesample is not an allowed token. Ignore it.", prop_name, i, tok.value().str());
            continue;
          }
        } else {
          PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}`'s {}'th timesample must be type `token`, but got type `{}`", prop_name, i, attr.type_name());
        }
      }

      has_timesamples = true;
      //return true;

    }

    if (has_default || has_timesamples) {
      result->set_value(animatable_value);
    }

    return true;

  }

  return false;
}